

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::callLoggingExit
          (CLIntercept *this,char *functionName,cl_int errorCode,cl_event *event,
          cl_sync_point_khr *syncPoint)

{
  undefined8 *in_RCX;
  char *in_RSI;
  CLIntercept *in_RDI;
  uint *in_R8;
  double __x;
  string str;
  lock_guard<std::mutex> lock;
  string *in_stack_000002d8;
  CLIntercept *in_stack_000002e0;
  mutex_type *in_stack_ffffffffffffff58;
  char *pcVar1;
  lock_guard<std::mutex> *in_stack_ffffffffffffff60;
  string local_88 [44];
  cl_int in_stack_ffffffffffffffa4;
  CEnumNameMap *in_stack_ffffffffffffffa8;
  string local_50 [40];
  uint *local_28;
  undefined8 *local_20;
  char *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"<<<< ",(allocator *)&stack0xffffffffffffffaf);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  getCallLoggingPrefix(in_stack_000002e0,in_stack_000002d8);
  std::__cxx11::string::operator+=(local_50,local_10);
  if (local_20 != (undefined8 *)0x0) {
    pcVar1 = in_RDI->m_StringBuffer;
    snprintf(pcVar1,0x4000," created event = %p",*local_20);
    std::__cxx11::string::operator+=(local_50,pcVar1);
  }
  if (local_28 != (uint *)0x0) {
    pcVar1 = in_RDI->m_StringBuffer;
    snprintf(pcVar1,0x4000," is sync point = %u",(ulong)*local_28);
    std::__cxx11::string::operator+=(local_50,pcVar1);
  }
  std::__cxx11::string::operator+=(local_50," -> ");
  CEnumNameMap::name_abi_cxx11_(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  std::__cxx11::string::operator+=(local_50,local_88);
  std::__cxx11::string::~string(local_88);
  __x = (double)std::__cxx11::string::operator+=(local_50,"\n");
  log(in_RDI,__x);
  std::__cxx11::string::~string(local_50);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1edffb);
  return;
}

Assistant:

void CLIntercept::callLoggingExit(
    const char* functionName,
    const cl_int errorCode,
    const cl_event* event,
    const cl_sync_point_khr* syncPoint )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    std::string str("<<<< ");
    getCallLoggingPrefix( str );

    str += functionName;

    if( event )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " created event = %p", *event );
        str += m_StringBuffer;
    }
    if( syncPoint )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " is sync point = %u", *syncPoint );
        str += m_StringBuffer;
    }

    str += " -> ";
    str += m_EnumNameMap.name( errorCode );
    str += "\n";

    log( str );
}